

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_>
* testing::internal::
  ActionResultHolder<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>>
  ::
  PerformDefaultAction<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>
            (FunctionMocker<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
             *func_mocker,ArgumentTuple *args,string *call_description)

{
  ActionResultHolder<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_>
  *this;
  Result local_60;
  error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
  local_40;
  
  this = (ActionResultHolder<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_>
          *)operator_new(0x28);
  FunctionMocker<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::PerformDefaultAction(&local_60,func_mocker,args,call_description);
  pstore::
  error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
  ::error_or(&local_40,&local_60);
  ActionResultHolder<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_>
  ::ActionResultHolder(this,(Wrapper *)&local_40);
  pstore::
  error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
  ::~error_or(&local_40);
  pstore::
  error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
  ::~error_or(&local_60);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }